

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

RGB __thiscall pbrt::RGBFilm::GetPixelRGB(RGBFilm *this,Point2i *p,Float splatScale)

{
  Pixel *pPVar1;
  undefined1 auVar2 [16];
  int c;
  long lVar3;
  float *pfVar4;
  SquareMatrix<3> *pSVar5;
  int iVar6;
  int j;
  Float *pFVar7;
  long lVar8;
  float fVar9;
  undefined1 auVar10 [16];
  RGB RVar11;
  float local_2c;
  undefined8 local_28;
  Float local_1c;
  undefined8 local_18;
  
  iVar6 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  pPVar1 = (this->pixels).values;
  iVar6 = ((this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar6) *
          ((p->super_Tuple2<pbrt::Point2,_int>).y -
          (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
          ((p->super_Tuple2<pbrt::Point2,_int>).x - iVar6);
  auVar2 = vcvtpd2ps_avx(*(undefined1 (*) [16])pPVar1[iVar6].rgbSum);
  local_28 = vmovlps_avx(auVar2);
  local_2c = (float)pPVar1[iVar6].rgbSum[2];
  fVar9 = (float)pPVar1[iVar6].weightSum;
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    auVar10._4_4_ = fVar9;
    auVar10._0_4_ = fVar9;
    auVar10._8_4_ = fVar9;
    auVar10._12_4_ = fVar9;
    auVar2 = vdivps_avx(auVar2,auVar10);
    local_28 = vmovlps_avx(auVar2);
    local_2c = (float)pPVar1[iVar6].rgbSum[2] / fVar9;
  }
  lVar3 = 0;
  do {
    pfVar4 = (float *)&local_28;
    if (((int)lVar3 != 0) && (pfVar4 = (float *)((long)&local_28 + 4), (int)lVar3 != 1)) {
      pfVar4 = &local_2c;
    }
    *pfVar4 = (float)(((double)splatScale *
                      (double)pPVar1[iVar6].splatRGB[lVar3].bits.super___atomic_base<unsigned_long>.
                              _M_i) / (double)this->filterIntegral + (double)*pfVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pSVar5 = &this->outputRGBFromSensorRGB;
  local_18 = 0;
  local_1c = 0.0;
  lVar3 = 0;
  do {
    iVar6 = (int)lVar3;
    pFVar7 = (Float *)&local_18;
    if ((iVar6 != 0) && (pFVar7 = (Float *)((long)&local_18 + 4), iVar6 != 1)) {
      pFVar7 = &local_1c;
    }
    *pFVar7 = 0.0;
    lVar8 = 0;
    do {
      pfVar4 = (float *)&local_28;
      if (((int)lVar8 != 0) && (pfVar4 = (float *)((long)&local_28 + 4), (int)lVar8 != 1)) {
        pfVar4 = &local_2c;
      }
      pFVar7 = (Float *)&local_18;
      if ((iVar6 != 0) && (pFVar7 = (Float *)((long)&local_18 + 4), iVar6 != 1)) {
        pFVar7 = &local_1c;
      }
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)*pfVar4),ZEXT416((uint)pSVar5->m[0][lVar8]),
                               ZEXT416((uint)*pFVar7));
      *pFVar7 = auVar2._0_4_;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar3 = lVar3 + 1;
    pSVar5 = (SquareMatrix<3> *)(pSVar5->m + 1);
  } while (lVar3 != 3);
  RVar11.b = local_1c;
  RVar11.r = (Float)(undefined4)local_18;
  RVar11.g = (Float)local_18._4_4_;
  return RVar11;
}

Assistant:

PBRT_CPU_GPU
    RGB GetPixelRGB(const Point2i &p, Float splatScale = 1) const {
        const Pixel &pixel = pixels[p];
        RGB rgb(pixel.rgbSum[0], pixel.rgbSum[1], pixel.rgbSum[2]);
        // Normalize _rgb_ with weight sum
        Float weightSum = pixel.weightSum;
        if (weightSum != 0)
            rgb /= weightSum;

        // Add splat value at pixel
        for (int c = 0; c < 3; ++c)
            rgb[c] += splatScale * pixel.splatRGB[c] / filterIntegral;

        // Convert _rgb_ to output RGB color space
        rgb = outputRGBFromSensorRGB * rgb;

        return rgb;
    }